

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void errortests(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  double *actual_00;
  double *predicted_00;
  double local_25b8;
  double temp [1200];
  FILE *ifp;
  int local_20;
  int M;
  int i;
  int N;
  double *actual;
  double *predicted;
  
  __stream = fopen("../data/eusm.txt","r");
  local_20 = 0;
  if (__stream != (FILE *)0x0) {
    while (iVar1 = local_20, iVar2 = feof(__stream), iVar2 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp + (long)local_20 + -1);
      local_20 = local_20 + 1;
    }
    actual_00 = (double *)malloc(800);
    predicted_00 = (double *)malloc(800);
    for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
      predicted_00[local_20] = 1716.18;
      actual_00[local_20] = temp[(long)(local_20 + 200) + -1];
    }
    me(predicted_00,actual_00,100);
    printf("Mean Error %g \n");
    mse(predicted_00,actual_00,100);
    printf("Mean Squared Error %g \n");
    rmse(predicted_00,actual_00,100);
    printf("Root Mean Squared Error %g \n");
    mae(predicted_00,actual_00,100);
    printf("Mean Absolute Error %g \n");
    mpe(predicted_00,actual_00,100);
    printf("Mean Percentage Error %g \n");
    mape(predicted_00,actual_00,100);
    printf("Mean Absolute Percentage Error %g \n");
    mase(predicted_00,actual_00,100,&local_25b8,iVar1 + -100);
    printf("Mean Absolute Scaled Error %g \n");
    free(actual_00);
    free(predicted_00);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void errortests() {
    double *predicted, *actual;
    int N,i,M;
    FILE *ifp;
	double temp[1200];

    ifp = fopen("../data/eusm.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

    M = i;
    N = 100;


    actual = (double*) malloc(sizeof(double)*N);
    predicted = (double*) malloc(sizeof(double)*N);

    for(i = 0; i < N;++i) {
        predicted[i] = 1716.18;
        actual[i] = temp[200+i];
    }

    printf("Mean Error %g \n",me(predicted,actual,N));
    printf("Mean Squared Error %g \n",mse(predicted,actual,N));
    printf("Root Mean Squared Error %g \n",rmse(predicted,actual,N));
    printf("Mean Absolute Error %g \n",mae(predicted,actual,N));
    printf("Mean Percentage Error %g \n",mpe(predicted,actual,N));
    printf("Mean Absolute Percentage Error %g \n",mape(predicted,actual,N));
    printf("Mean Absolute Scaled Error %g \n",mase(predicted,actual,N,temp,M-N));

    free(actual);
    free(predicted);
}